

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser-test.c++
# Opt level: O2

void __thiscall capnp::anon_unknown_0::FakeFileReader::~FakeFileReader(FakeFileReader *this)

{
  kj::Own<const_kj::Directory,_std::nullptr_t>::dispose(&this->current);
  kj::Array<kj::String>::~Array(&(this->cwd).parts);
  kj::Own<const_kj::Directory,_std::nullptr_t>::dispose(&this->root);
  return;
}

Assistant:

void add(kj::StringPtr name, kj::StringPtr content) {
    root->openFile(cwd.evalNative(name), kj::WriteMode::CREATE | kj::WriteMode::CREATE_PARENT)
        ->writeAll(content);
  }